

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::UnknownFieldSetTest_Swap_Test::UnknownFieldSetTest_Swap_Test
          (UnknownFieldSetTest_Swap_Test *this)

{
  UnknownFieldSetTest_Swap_Test *this_local;
  
  UnknownFieldSetTest::UnknownFieldSetTest(&this->super_UnknownFieldSetTest);
  (this->super_UnknownFieldSetTest).super_Test._vptr_Test =
       (_func_int **)&PTR__UnknownFieldSetTest_Swap_Test_029f2e68;
  return;
}

Assistant:

TEST_F(UnknownFieldSetTest, Swap) {
  unittest::TestEmptyMessage other_message;
  ASSERT_TRUE(other_message.ParseFromString(GetBizarroData()));

  EXPECT_GT(empty_message_.unknown_fields().field_count(), 0);
  EXPECT_GT(other_message.unknown_fields().field_count(), 0);
  const std::string debug_string = empty_message_.DebugString();
  const std::string other_debug_string = other_message.DebugString();
  EXPECT_NE(debug_string, other_debug_string);

  empty_message_.Swap(&other_message);
  EXPECT_EQ(debug_string, other_message.DebugString());
  EXPECT_EQ(other_debug_string, empty_message_.DebugString());
}